

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret1.cxx
# Opt level: O1

int main(int ac,char **av)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string logfile;
  string logarg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callargs;
  string exename;
  string arg;
  CommandLineArguments args;
  allocator_type local_189;
  undefined8 local_188;
  undefined8 local_180;
  char **local_178;
  ulong local_170;
  string local_168;
  undefined1 *local_148;
  char *local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  undefined1 local_128 [32];
  long *local_108 [2];
  long local_f8 [2];
  undefined8 local_e8;
  char *local_e0;
  long local_d8;
  ulong local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  CommandLineArguments local_48;
  
  cmsys::Encoding::CommandLineArguments::Main(&local_48,ac,av);
  uVar1 = cmsys::Encoding::CommandLineArguments::argc(&local_48);
  local_178 = cmsys::Encoding::CommandLineArguments::argv(&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,*local_178,(allocator<char> *)&local_c8);
  local_148 = &local_138;
  local_140 = (char *)0x0;
  local_138 = 0;
  lVar2 = std::__cxx11::string::find((char *)local_108,0x262004,0);
  if (lVar2 == -1) {
    lVar2 = std::__cxx11::string::find((char *)local_108,0x262019,0);
    if (lVar2 != -1) {
      pcVar4 = "-log-file=";
      goto LAB_0011038d;
    }
    lVar2 = std::__cxx11::string::find((char *)local_108,0x262020,0);
    if (lVar2 == -1) {
      uVar10 = 0;
      lVar2 = std::__cxx11::string::find((char *)local_108,0x262026,0);
      if (lVar2 == -1) {
        local_180 = 0;
      }
      else {
        uVar10 = 1;
        uVar3 = std::__cxx11::string::_M_replace((ulong)&local_148,0,local_140,0x262034);
        local_180 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
      }
    }
    else {
      uVar10 = 0;
      uVar3 = std::__cxx11::string::_M_replace((ulong)&local_148,0,local_140,0x262023);
      local_180 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
    }
  }
  else {
    pcVar4 = "--log-file=";
LAB_0011038d:
    uVar10 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_148,0,local_140,(ulong)pcVar4);
    local_180 = 0;
  }
  if (local_140 != (char *)0x0) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    local_168._M_string_length = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    bVar11 = 1 < (int)uVar1;
    local_170 = (ulong)uVar1;
    local_e8 = uVar10;
    if ((int)uVar1 < 2) {
      local_188 = 0;
    }
    else {
      local_d8 = 1 - (ulong)(uVar1 - 1);
      local_188 = 0;
      uVar6 = 2;
      local_d0 = (ulong)uVar1;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,local_178[uVar6 - 1],(allocator<char> *)local_128);
        lVar2 = std::__cxx11::string::find((char *)&local_c8,(ulong)local_148,0);
        bVar12 = true;
        if (lVar2 == 0) {
          if ((byte)local_180 == '\0') {
            std::__cxx11::string::substr((ulong)local_128,(ulong)&local_c8);
            std::__cxx11::string::operator=((string *)&local_168,(string *)local_128);
            if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
              operator_delete((void *)local_128._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_128._16_8_)->_M_p + 1));
            }
          }
          else if (local_d8 + uVar6 == 2) {
            local_188 = 1;
            bVar12 = false;
          }
          else {
            pcVar4 = local_178[uVar6];
            local_e0 = (char *)local_168._M_string_length;
            strlen(pcVar4);
            std::__cxx11::string::_M_replace((ulong)&local_168,0,local_e0,(ulong)pcVar4);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar12) break;
        bVar11 = uVar6 < local_d0;
        bVar12 = uVar6 != uVar1;
        uVar6 = uVar6 + 1;
      } while (bVar12);
    }
    if (bVar11) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                 local_168.field_2._M_local_buf[0]) + 1);
      }
      iVar5 = (int)local_188;
      goto LAB_001107e0;
    }
    iVar5 = 1;
    if (1 < (int)local_170) {
      uVar9 = local_170 & 0xffffffff;
      uVar6 = 1;
      uVar8 = 1;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,local_178[uVar8],(allocator<char> *)local_128);
        lVar2 = std::__cxx11::string::find((char *)&local_c8,0x26203f,0);
        if (lVar2 == 0) {
          uVar6 = uVar8 & 0xffffffff;
        }
        iVar5 = (int)uVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    uVar6 = local_170;
    if ((char *)local_168._M_string_length != (char *)0x0) {
      cmsys::SystemTools::Touch(&local_168,true);
      iVar5 = iVar5 + (uint)(byte)local_180 + 1;
      if (((byte)local_e8 & iVar5 < (int)uVar6) == 1) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/usr/bin/cmake","");
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"-E","");
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"env","");
        std::operator+(&local_68,"PSEUDO_LOGFILE=",&local_168);
        __l._M_len = 4;
        __l._M_array = &local_c8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_128,__l,&local_189);
        lVar2 = -0x80;
        paVar7 = &local_68.field_2;
        do {
          if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar7->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                            paVar7->_M_allocated_capacity + 1);
          }
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(&paVar7->_M_allocated_capacity + -4);
          lVar2 = lVar2 + 0x20;
        } while (lVar2 != 0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<char_const*const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_128,
                   local_128._8_8_,local_178 + iVar5);
        cmSystemTools::RunSingleCommand
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_128,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                   (cmDuration)0x0,Auto);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                               local_168.field_2._M_local_buf[0]) + 1);
    }
  }
  iVar5 = 1;
LAB_001107e0:
  if (local_148 != &local_138) {
    operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_48);
  return iVar5;
}

Assistant:

int main(int ac, char** av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;
  // execute the part after the last argument?
  // the logfile path gets passed as environment variable PSEUDO_LOGFILE
  bool exec = false;

  if (exename.find("valgrind") != std::string::npos) {
    logarg = "--log-file=";
  } else if (exename.find("purify") != std::string::npos) {
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  } else if (exename.find("BC") != std::string::npos) {
    nextarg = true;
    logarg = "/X";
  } else if (exename.find("cuda-memcheck") != std::string::npos) {
    nextarg = true;
    exec = true;
    logarg = "--log-file";
  }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0) {
        if (nextarg) {
          if (i == argc - 1) {
            return 1; // invalid command line
          }
          logfile = argv[i + 1];
        } else {
          logfile = arg.substr(logarg.length());
        }
        // keep searching, it may be overridden later to provoke an error
      }
    }

    // find the last argument position
    int lastarg_pos = 1;
    for (int i = 1; i < argc; ++i) {
      std::string arg = argv[i];
      if (arg.find("--") == 0) {
        lastarg_pos = i;
      }
    }

    if (!logfile.empty()) {
      cmSystemTools::Touch(logfile, true);
      // execute everything after the last argument with additional environment
      int callarg_pos = lastarg_pos + (nextarg ? 2 : 1);
      if (exec && callarg_pos < argc) {
        std::vector<std::string> callargs{ CMAKE_COMMAND, "-E", "env",
                                           "PSEUDO_LOGFILE=" + logfile };
        callargs.insert(callargs.end(), &argv[callarg_pos], &argv[argc]);
        cmSystemTools::RunSingleCommand(callargs);
      }
    }
  }

  return RETVAL;
}